

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::Next(MergingIterator *this)

{
  Comparator *pCVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  IteratorWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar5;
  Slice local_50;
  undefined8 local_40 [2];
  Slice local_30;
  IteratorWrapper *local_20;
  IteratorWrapper *child;
  MergingIterator *pMStack_10;
  int i;
  MergingIterator *this_local;
  
  pMStack_10 = this;
  uVar3 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar3 & 1) != 0) {
    if (this->direction_ != kForward) {
      for (child._4_4_ = 0; child._4_4_ < this->n_; child._4_4_ = child._4_4_ + 1) {
        this_00 = this->children_ + child._4_4_;
        local_20 = this_00;
        if (this_00 != this->current_) {
          iVar4 = (*(this->super_Iterator)._vptr_Iterator[8])();
          local_30.data_ = (char *)CONCAT44(extraout_var,iVar4);
          IteratorWrapper::Seek(this_00,&local_30);
          bVar2 = IteratorWrapper::Valid(local_20);
          bVar5 = false;
          if (bVar2) {
            pCVar1 = this->comparator_;
            iVar4 = (*(this->super_Iterator)._vptr_Iterator[8])();
            local_40[0] = CONCAT44(extraout_var_00,iVar4);
            local_50 = IteratorWrapper::key(local_20);
            iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_40,&local_50);
            bVar5 = iVar4 == 0;
          }
          if (bVar5) {
            IteratorWrapper::Next(local_20);
          }
        }
      }
      this->direction_ = kForward;
    }
    IteratorWrapper::Next(this->current_);
    FindSmallest(this);
    return;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                ,0x38,"virtual void leveldb::(anonymous namespace)::MergingIterator::Next()");
}

Assistant:

void Next() override {
    assert(Valid());

    // Ensure that all children are positioned after key().
    // If we are moving in the forward direction, it is already
    // true for all of the non-current_ children since current_ is
    // the smallest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kForward) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid() &&
              comparator_->Compare(key(), child->key()) == 0) {
            child->Next();
          }
        }
      }
      direction_ = kForward;
    }

    current_->Next();
    FindSmallest();
  }